

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

FSE_repeat
ZSTD_dictNCountRepeat(short *normalizedCounter,uint dictMaxSymbolValue,uint maxSymbolValue)

{
  short *psVar1;
  long lVar2;
  
  if (maxSymbolValue <= dictMaxSymbolValue) {
    lVar2 = 0;
    do {
      if ((ulong)maxSymbolValue + 1 == lVar2) {
        return FSE_repeat_valid;
      }
      psVar1 = normalizedCounter + lVar2;
      lVar2 = lVar2 + 1;
    } while (*psVar1 != 0);
  }
  return FSE_repeat_check;
}

Assistant:

static FSE_repeat ZSTD_dictNCountRepeat(short* normalizedCounter, unsigned dictMaxSymbolValue, unsigned maxSymbolValue)
{
    U32 s;
    if (dictMaxSymbolValue < maxSymbolValue) {
        return FSE_repeat_check;
    }
    for (s = 0; s <= maxSymbolValue; ++s) {
        if (normalizedCounter[s] == 0) {
            return FSE_repeat_check;
        }
    }
    return FSE_repeat_valid;
}